

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O3

Message * __thiscall
proto2_unittest::TestConflictingMethodNames::GetRequestPrototype
          (TestConflictingMethodNames *this,MethodDescriptor *method)

{
  ServiceDescriptor *pSVar1;
  LogMessage local_20;
  
  pSVar1 = method->service_;
  google::protobuf::internal::AssignDescriptors
            (&
             descriptor_table_google_2fprotobuf_2fcompiler_2fcpp_2ftest_5fbad_5fidentifiers_5fproto2_2eproto
            );
  if (pSVar1 == file_level_service_descriptors_google_2fprotobuf_2fcompiler_2fcpp_2ftest_5fbad_5fidentifiers_5fproto2_2eproto
                [0]) {
    if ((int)((ulong)((long)method - (long)method->service_->methods_) >> 4) * -0x33333333 == 0) {
      return (Message *)&_DummyMessage_default_instance_;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
               ,0x23b3);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,(char (*) [44])"Bad method index; this should never happen.");
  }
  else {
    GetRequestPrototype();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

const ::google::protobuf::Message& TestConflictingMethodNames::GetRequestPrototype(
    const ::google::protobuf::MethodDescriptor* PROTOBUF_NONNULL method) const {
  ABSL_DCHECK_EQ(method->service(), descriptor());
  switch (method->index()) {
    case 0:
      return ::proto2_unittest::DummyMessage::default_instance();

    default:
      ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
      return *::google::protobuf::MessageFactory::generated_factory()->GetPrototype(
          method->input_type());
  }
}